

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

LabelInstr ** __thiscall
HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator>::FindOrInsert
          (HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator> *this,LabelInstr *element,int value)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  Type *pTVar4;
  undefined4 *puVar5;
  Bucket<IR::LabelInstr_*> *newBucket;
  Bucket<IR::LabelInstr_*> *bucket;
  EditingIterator iter;
  uint depth;
  uint hash;
  int value_local;
  LabelInstr *element_local;
  HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator> *this_local;
  
  uVar3 = Hash(this,value);
  iter.last._4_4_ = 1;
  SListBase<Bucket<IR::LabelInstr_*>,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
            ((EditingIterator *)&bucket,this->table + uVar3);
  do {
    bVar2 = SListBase<Bucket<IR::LabelInstr_*>,_Memory::ArenaAllocator,_RealCount>::EditingIterator
            ::Next((EditingIterator *)&bucket);
    if (!bVar2) {
LAB_00630e78:
      pTVar4 = SListBase<Bucket<IR::LabelInstr_*>,_Memory::ArenaAllocator,_RealCount>::
               EditingIterator::InsertNodeBefore((EditingIterator *)&bucket,this->alloc);
      if (pTVar4 == (Type *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/HashTable.h"
                           ,0x99,"(newBucket != nullptr)","newBucket != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      pTVar4->value = value;
      pTVar4->element = element;
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Insert(this->stats,iter.last._4_4_);
      }
      return (LabelInstr **)0x0;
    }
    pTVar4 = SListBase<Bucket<IR::LabelInstr_*>,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                       ((Iterator *)&bucket);
    if (pTVar4->value <= value) {
      if (pTVar4->value == value) {
        return &pTVar4->element;
      }
      goto LAB_00630e78;
    }
    iter.last._4_4_ = iter.last._4_4_ + 1;
  } while( true );
}

Assistant:

T * FindOrInsert(T element, int value)
    {
        uint hash = this->Hash(value);

#if PROFILE_DICTIONARY
        uint depth = 1;
#endif
        // Keep sorted
        FOREACH_SLISTBASE_ENTRY_EDITING(Bucket<T>, bucket, &this->table[hash], iter)
        {
            if (bucket.value <= value)
            {
                if (bucket.value == value)
                {
                    return &(bucket.element);
                }
                break;
            }
#if PROFILE_DICTIONARY
            ++depth;
#endif
        } NEXT_SLISTBASE_ENTRY_EDITING;

        Bucket<T> * newBucket = iter.InsertNodeBefore(this->alloc);
        Assert(newBucket != nullptr);
        newBucket->value = value;
        newBucket->element = element;
#if PROFILE_DICTIONARY
        if (stats)
            stats->Insert(depth);
#endif
        return nullptr;
    }